

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLexer.cpp
# Opt level: O2

void __thiscall LStringLexer::LStringLexer(LStringLexer *this,string *str)

{
  (this->super_LLexer).prev_char = '\0';
  (this->super_LLexer)._vptr_LLexer = (_func_int **)&PTR__LStringLexer_001225c8;
  (this->str)._M_dataplus._M_p = (pointer)&(this->str).field_2;
  (this->str)._M_string_length = 0;
  (this->str).field_2._M_local_buf[0] = '\0';
  this->cursor = 0;
  std::__cxx11::string::operator=((string *)&this->str,(string *)str);
  (this->super_LLexer).prev_char = '\0';
  this->cursor = 0;
  return;
}

Assistant:

LStringLexer::LStringLexer(std::string str) {
    this->str = std::move(str);
    this->prev_char = 0;
    this->cursor = 0;
}